

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ss_fixdown(uchar *Td,int *PA,int *SA,int i,int size)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int e;
  int d;
  int c;
  int v;
  int k;
  int j;
  int size_local;
  int i_local;
  int *SA_local;
  int *PA_local;
  uchar *Td_local;
  
  iVar2 = SA[i];
  bVar1 = Td[PA[iVar2]];
  i_local = i;
  while( true ) {
    k = i_local * 2 + 1;
    if (size <= k) break;
    iVar3 = i_local * 2 + 2;
    d = (uint)Td[PA[SA[k]]];
    if ((uint)Td[PA[SA[k]]] < (uint)Td[PA[SA[iVar3]]]) {
      d = (uint)Td[PA[SA[iVar3]]];
      k = iVar3;
    }
    if ((uint)d <= (uint)bVar1) break;
    SA[i_local] = SA[k];
    i_local = k;
  }
  SA[i_local] = iVar2;
  return;
}

Assistant:

static INLINE
void
ss_fixdown(const unsigned char *Td, const int *PA,
           int *SA, int i, int size) {
  int j, k;
  int v;
  int c, d, e;

  for(v = SA[i], c = Td[PA[v]]; (j = 2 * i + 1) < size; SA[i] = SA[k], i = k) {
    d = Td[PA[SA[k = j++]]];
    if(d < (e = Td[PA[SA[j]]])) { k = j; d = e; }
    if(d <= c) { break; }
  }
  SA[i] = v;
}